

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListGetNextCommandIdWithKernelsExp
          (ze_command_list_handle_t hCommandList,ze_mutable_command_id_exp_desc_t *desc,
          uint32_t numKernels,ze_kernel_handle_t *phKernels,uint64_t *pCommandId)

{
  ze_pfnCommandListGetNextCommandIdWithKernelsExp_t pfnGetNextCommandIdWithKernelsExp;
  ze_result_t result;
  uint64_t *pCommandId_local;
  ze_kernel_handle_t *phKernels_local;
  uint32_t numKernels_local;
  ze_mutable_command_id_exp_desc_t *desc_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnGetNextCommandIdWithKernelsExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c498 != (code *)0x0) {
    pfnGetNextCommandIdWithKernelsExp._4_4_ =
         (*DAT_0011c498)(hCommandList,desc,numKernels,phKernels,pCommandId);
  }
  return pfnGetNextCommandIdWithKernelsExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListGetNextCommandIdWithKernelsExp(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        const ze_mutable_command_id_exp_desc_t* desc,   ///< [in][out] pointer to mutable command identifier descriptor
        uint32_t numKernels,                            ///< [in][optional] number of entries on phKernels list
        ze_kernel_handle_t* phKernels,                  ///< [in][optional][range(0, numKernels)] list of kernels that user can
                                                        ///< switch between using ::zeCommandListUpdateMutableCommandKernelsExp
                                                        ///< call
        uint64_t* pCommandId                            ///< [out] pointer to mutable command identifier to be written
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetNextCommandIdWithKernelsExp = context.zeDdiTable.CommandListExp.pfnGetNextCommandIdWithKernelsExp;
        if( nullptr != pfnGetNextCommandIdWithKernelsExp )
        {
            result = pfnGetNextCommandIdWithKernelsExp( hCommandList, desc, numKernels, phKernels, pCommandId );
        }
        else
        {
            // generic implementation
        }

        return result;
    }